

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_sh_wsh_miniscript_derive_Test::TestBody
          (Descriptor_Parse_sh_wsh_miniscript_derive_Test *this)

{
  bool bVar1;
  reference argument;
  char *pcVar2;
  char *rhs;
  size_type sVar3;
  reference pvVar4;
  AssertHelper local_1e78;
  Message local_1e70;
  DescriptorScriptReference local_1e68;
  Script local_1b18;
  string local_1ae0;
  undefined1 local_1ac0 [8];
  AssertionResult gtest_ar_13;
  Message local_1aa8;
  DescriptorScriptReference local_1aa0;
  Address local_1750;
  string local_15d8;
  undefined1 local_15b8 [8];
  AssertionResult gtest_ar_12;
  Message local_15a0;
  Script local_1598;
  string local_1560;
  undefined1 local_1540 [8];
  AssertionResult gtest_ar_11;
  Message local_1528;
  Address local_1520;
  string local_13a8;
  undefined1 local_1388 [8];
  AssertionResult gtest_ar_10;
  Message local_1370;
  int local_1364;
  size_type local_1360;
  undefined1 local_1358 [8];
  AssertionResult gtest_ar_9;
  Message local_1340;
  DescriptorScriptReference local_1338;
  Script local_fe8;
  string local_fb0;
  undefined1 local_f90 [8];
  AssertionResult gtest_ar_8;
  Message local_f78;
  DescriptorScriptReference local_f70;
  Address local_c20;
  string local_aa8;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_7;
  Message local_a70;
  Script local_a68;
  string local_a30;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_6;
  Message local_9f8;
  Address local_9f0;
  string local_878;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_5;
  Message local_840;
  int local_834;
  size_type local_830;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_4;
  Message local_810;
  string local_808;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_3;
  Message local_7d0;
  string local_7c8;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_2;
  Message local_790;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_1;
  Message local_770;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_768;
  AssertHelper local_750;
  Message local_748;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_740;
  AssertHelper local_728;
  Message local_720;
  Script local_718;
  AssertHelper local_6e0;
  Message local_6d8;
  Script local_6d0;
  AssertHelper local_698;
  Message local_690;
  string local_688;
  AssertHelper local_668;
  Message local_660 [2];
  CfdException *anon_var_0;
  byte local_611;
  char *pcStack_610;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_600 [2];
  Descriptor local_5f0;
  allocator local_481;
  value_type local_480;
  allocator local_459;
  value_type local_458;
  undefined1 local_438 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list1;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_278 [8];
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list2;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  Script gen_script;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_sh_wsh_miniscript_derive_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)&script_list2.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)local_278);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_30,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arg_list2.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"0",&local_459);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&arg_list2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"44",&local_481);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_5f0,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f0);
      cfd::core::Descriptor::~Descriptor(&local_5f0);
    }
  }
  else {
    testing::Message::Message(local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x32f,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(local_600);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff9f0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff9f0);
  if (bVar1) {
    local_611 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                ((Script *)&anon_var_0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),(Script *)&anon_var_0);
      cfd::core::Script::~Script((Script *)&anon_var_0);
    }
    if ((local_611 & 1) != 0) goto LAB_003571dc;
    pcStack_610 = 
    "Expected: locking_script = desc.GetLockingScript() throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_660);
  testing::internal::AssertHelper::AssertHelper
            (&local_668,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
             ,0x330,pcStack_610);
  testing::internal::AssertHelper::operator=(&local_668,local_660);
  testing::internal::AssertHelper::~AssertHelper(&local_668);
  testing::Message::~Message(local_660);
LAB_003571dc:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_688,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_688);
      std::__cxx11::string::~string((string *)&local_688);
    }
  }
  else {
    testing::Message::Message(&local_690);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x331,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_698,&local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    testing::Message::~Message(&local_690);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      argument = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arg_list2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      cfd::core::Descriptor::GetLockingScript
                (&local_6d0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,argument);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_6d0);
      cfd::core::Script::~Script(&local_6d0);
    }
  }
  else {
    testing::Message::Message(&local_6d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x332,
               "Expected: locking_script = desc.GetLockingScript(arg_list1[0]) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    testing::Message::~Message(&local_6d8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_718,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_438);
      cfd::core::Script::operator=
                ((Script *)
                 &script_list.
                  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_718);
      cfd::core::Script::~Script(&local_718);
    }
  }
  else {
    testing::Message::Message(&local_720);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x333,
               "Expected: gen_script = desc.GetLockingScript(arg_list2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_728,&local_720);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    testing::Message::~Message(&local_720);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_740,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&arg_list2.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)&script_list2.
                      super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_740);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_740);
    }
  }
  else {
    testing::Message::Message(&local_748);
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x334,
               "Expected: script_list = desc.GetReferenceAll(&arg_list1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    testing::Message::~Message(&local_748);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_768,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_438);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)local_278,&local_768);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_768);
    }
  }
  else {
    testing::Message::Message(&local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x335,
               "Expected: script_list2 = desc.GetReferenceAll(&arg_list2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_770);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_788,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_788);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x336,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  cfd::core::Script::ToString_abi_cxx11_(&local_7c8,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7a8,"locking_script.ToString().c_str()",
             "\"OP_HASH160 a5257435d9c28329c8b8ab810f8813d347eddd17 OP_EQUAL\"",pcVar2,
             "OP_HASH160 a5257435d9c28329c8b8ab810f8813d347eddd17 OP_EQUAL");
  std::__cxx11::string::~string((string *)&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x338,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_808,
             (Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7e8,"gen_script.ToString().c_str()",
             "\"OP_HASH160 a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa691 OP_EQUAL\"",pcVar2,
             "OP_HASH160 a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa691 OP_EQUAL");
  std::__cxx11::string::~string((string *)&local_808);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x33a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  local_830 = std::
              vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      *)&script_list2.
                         super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_834 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_828,"script_list.size()","1",&local_830,&local_834);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x33c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_840);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  sVar3 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)&script_list2.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar3 == 1) {
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)&script_list2.
                              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_9f0,pvVar4,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_878,&local_9f0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_858,
               "script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"3GkEHYNEauSenEsqmnhjb9HGgb5pt4oaDm\"",pcVar2,"3GkEHYNEauSenEsqmnhjb9HGgb5pt4oaDm")
    ;
    std::__cxx11::string::~string((string *)&local_878);
    cfd::core::Address::~Address(&local_9f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
    if (!bVar1) {
      testing::Message::Message(&local_9f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x33f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_9f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_9f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)&script_list2.
                              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_a68,pvVar4);
    cfd::core::Script::ToString_abi_cxx11_(&local_a30,&local_a68);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_a10,"script_list[0].GetRedeemScript().ToString().c_str()",
               "\"0 ac9239e9359aaed6ef6c208ae6893ee0fabb5bb0a4775c0883902367a56eec58\"",pcVar2,
               "0 ac9239e9359aaed6ef6c208ae6893ee0fabb5bb0a4775c0883902367a56eec58");
    std::__cxx11::string::~string((string *)&local_a30);
    cfd::core::Script::~Script(&local_a68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
    if (!bVar1) {
      testing::Message::Message(&local_a70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x341,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_a70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_a70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)&script_list2.
                              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_f70,pvVar4);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_c20,&local_f70,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_aa8,&local_c20);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_a88,
               "script_list[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"bc1q4jfrn6f4n2hddmmvyz9wdzf7uratkkas53m4czyrjq3k0ftwa3vqvjzukn\"",pcVar2,
               "bc1q4jfrn6f4n2hddmmvyz9wdzf7uratkkas53m4czyrjq3k0ftwa3vqvjzukn");
    std::__cxx11::string::~string((string *)&local_aa8);
    cfd::core::Address::~Address(&local_c20);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_f70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
    if (!bVar1) {
      testing::Message::Message(&local_f78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x343,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_f78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_f78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)&script_list2.
                              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1338,pvVar4);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_fe8,&local_1338);
    cfd::core::Script::ToString_abi_cxx11_(&local_fb0,&local_fe8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_f90,
               "script_list[0].GetChild().GetRedeemScript().ToString().c_str()",
               "\"OP_IF OP_DUP OP_HASH160 7620e8418ab0d9835cbce5316bb9c8cbfbb82726 OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 4de5a5faaee2ab254f2f042503acada802dd9714 OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG\""
               ,pcVar2,
               "OP_IF OP_DUP OP_HASH160 7620e8418ab0d9835cbce5316bb9c8cbfbb82726 OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 4de5a5faaee2ab254f2f042503acada802dd9714 OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG"
              );
    std::__cxx11::string::~string((string *)&local_fb0);
    cfd::core::Script::~Script(&local_fe8);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1338);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f90);
    if (!bVar1) {
      testing::Message::Message(&local_1340);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x345,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1340);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1340);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f90);
  }
  local_1360 = std::
               vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       *)local_278);
  local_1364 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1358,"script_list2.size()","1",&local_1360,&local_1364);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1358);
  if (!bVar1) {
    testing::Message::Message(&local_1370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x348,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1358);
  sVar3 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_278);
  if (sVar3 == 1) {
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_1520,pvVar4,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_13a8,&local_1520);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1388,
               "script_list2[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt\"",pcVar2,"3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt")
    ;
    std::__cxx11::string::~string((string *)&local_13a8);
    cfd::core::Address::~Address(&local_1520);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
    if (!bVar1) {
      testing::Message::Message(&local_1528);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1388);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x34b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1528);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_1528);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_1598,pvVar4);
    cfd::core::Script::ToString_abi_cxx11_(&local_1560,&local_1598);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1540,"script_list2[0].GetRedeemScript().ToString().c_str()",
               "\"0 e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa\"",pcVar2,
               "0 e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa");
    std::__cxx11::string::~string((string *)&local_1560);
    cfd::core::Script::~Script(&local_1598);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1540);
    if (!bVar1) {
      testing::Message::Message(&local_15a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1540);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x34d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_15a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_15a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1540);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1aa0,pvVar4);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_1750,&local_1aa0,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_15d8,&local_1750);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_15b8,
               "script_list2[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh\"",pcVar2,
               "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh");
    std::__cxx11::string::~string((string *)&local_15d8);
    cfd::core::Address::~Address(&local_1750);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1aa0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b8);
    if (!bVar1) {
      testing::Message::Message(&local_1aa8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x34f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_1aa8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_1aa8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b8);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1e68,pvVar4);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_1b18,&local_1e68);
    cfd::core::Script::ToString_abi_cxx11_(&local_1ae0,&local_1b18);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1ac0,
               "script_list2[0].GetChild().GetRedeemScript().ToString().c_str()",
               "\"OP_IF OP_DUP OP_HASH160 520e6e72bcd5b616bc744092139bd759c31d6bbe OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 5ab62f0be26fe9d6205a155403f33e2ad2d31efe OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG\""
               ,pcVar2,
               "OP_IF OP_DUP OP_HASH160 520e6e72bcd5b616bc744092139bd759c31d6bbe OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 5ab62f0be26fe9d6205a155403f33e2ad2d31efe OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG"
              );
    std::__cxx11::string::~string((string *)&local_1ae0);
    cfd::core::Script::~Script(&local_1b18);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1e68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ac0);
    if (!bVar1) {
      testing::Message::Message(&local_1e70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ac0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x351,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e78,&local_1e70);
      testing::internal::AssertHelper::~AssertHelper(&local_1e78);
      testing::Message::~Message(&local_1e70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ac0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arg_list2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)local_278);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)&script_list2.
                super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_sh_wsh_miniscript_derive) {
  std::string descriptor = "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;
  std::vector<DescriptorScriptReference> script_list2;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  std::vector<std::string> arg_list2;
  arg_list1.push_back("0");
  arg_list2.push_back("44");
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_THROW(locking_script = desc.GetLockingScript(), CfdException);
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript(arg_list1[0]));
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript(arg_list2));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(&arg_list1));
  EXPECT_NO_THROW(script_list2 = desc.GetReferenceAll(&arg_list2));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "OP_HASH160 a5257435d9c28329c8b8ab810f8813d347eddd17 OP_EQUAL");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "OP_HASH160 a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa691 OP_EQUAL");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "3GkEHYNEauSenEsqmnhjb9HGgb5pt4oaDm");
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "0 ac9239e9359aaed6ef6c208ae6893ee0fabb5bb0a4775c0883902367a56eec58");
    EXPECT_STREQ(script_list[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1q4jfrn6f4n2hddmmvyz9wdzf7uratkkas53m4czyrjq3k0ftwa3vqvjzukn");
    EXPECT_STREQ(script_list[0].GetChild().GetRedeemScript().ToString().c_str(),
      "OP_IF OP_DUP OP_HASH160 7620e8418ab0d9835cbce5316bb9c8cbfbb82726 OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 4de5a5faaee2ab254f2f042503acada802dd9714 OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG");
  }

  EXPECT_EQ(script_list2.size(), 1);
  if (script_list2.size() == 1) {
    EXPECT_STREQ(script_list2[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt");
    EXPECT_STREQ(script_list2[0].GetRedeemScript().ToString().c_str(),
      "0 e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa");
    EXPECT_STREQ(script_list2[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh");
    EXPECT_STREQ(script_list2[0].GetChild().GetRedeemScript().ToString().c_str(),
      "OP_IF OP_DUP OP_HASH160 520e6e72bcd5b616bc744092139bd759c31d6bbe OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 5ab62f0be26fe9d6205a155403f33e2ad2d31efe OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG");
  }
}